

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  int iVar5;
  __m256i c;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int iVar10;
  parasail_result_t *result;
  __m256i *palVar11;
  __m256i *palVar12;
  __m256i *palVar13;
  __m256i *b;
  __m256i *palVar14;
  char *pcVar15;
  ulong size;
  int iVar16;
  char *__format;
  ulong uVar17;
  int iVar18;
  long lVar19;
  short sVar20;
  undefined4 uVar21;
  undefined2 uVar22;
  undefined2 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined4 in_stack_ffffffffffffff40;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile16.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            iVar10 = ppVar3->max;
            result = parasail_result_new();
            if (result != (parasail_result_t *)0x0) {
              size = (ulong)uVar1 + 0xf >> 4;
              result->flag = result->flag | 0x10200804;
              palVar11 = parasail_memalign___m256i(0x20,size);
              palVar12 = parasail_memalign___m256i(0x20,size);
              palVar13 = parasail_memalign___m256i(0x20,size);
              b = parasail_memalign___m256i(0x20,size);
              if ((b != (__m256i *)0x0 && palVar13 != (__m256i *)0x0) &&
                  (palVar12 != (__m256i *)0x0 && palVar11 != (__m256i *)0x0)) {
                iVar16 = 0;
                uVar21 = 0;
                uVar22 = (undefined2)open;
                uVar23 = (undefined2)gap;
                auVar4._8_8_ = s2;
                auVar4._0_8_ = result;
                auVar4._16_4_ = in_stack_ffffffffffffff40;
                auVar4._20_4_ = iVar10;
                auVar4._24_8_ = 0;
                parasail_memset___m256i(palVar11,(__m256i)(auVar4 << 0x40),size);
                c[0]._4_4_ = uVar21;
                c[0]._0_4_ = iVar16;
                c[1] = (longlong)result;
                c[2] = (longlong)s2;
                c[3]._0_4_ = in_stack_ffffffffffffff40;
                c[3]._4_4_ = iVar10;
                parasail_memset___m256i(b,c,size);
                auVar8._8_8_ = 0x8000800080008000;
                auVar8._0_8_ = 0x8000800080008000;
                auVar7._16_8_ = 0x8000800080008000;
                auVar7._0_16_ = auVar8;
                auVar7._24_8_ = 0x8000800080008000;
                auVar26 = ZEXT3264(CONCAT230(0x8000,CONCAT228(0x8000,CONCAT226(0x8000,CONCAT224(
                                                  0x8000,CONCAT222(0x8000,CONCAT220(0x8000,CONCAT218
                                                  (0x8000,CONCAT216(0x8000,CONCAT214(0x8000,
                                                  CONCAT212(0x8000,CONCAT210(0x8000,CONCAT28(0x8000,
                                                  0x8000800080008000)))))))))))));
                uVar21 = 0x8000;
                auVar24._8_2_ = 0x8000;
                auVar24._0_8_ = 0x8000800080008000;
                auVar24._10_2_ = 0x8000;
                auVar24._12_2_ = 0x8000;
                auVar24._14_2_ = 0x8000;
                uVar17 = 0;
                auVar25 = ZEXT3264(auVar7);
                auVar9._2_2_ = uVar22;
                auVar9._0_2_ = uVar22;
                auVar9._4_2_ = uVar22;
                auVar9._6_2_ = uVar22;
                auVar9._8_2_ = uVar22;
                auVar9._10_2_ = uVar22;
                auVar9._12_2_ = uVar22;
                auVar9._14_2_ = uVar22;
                auVar9._16_2_ = uVar22;
                auVar9._18_2_ = uVar22;
                auVar9._20_2_ = uVar22;
                auVar9._22_2_ = uVar22;
                auVar9._24_2_ = uVar22;
                auVar9._26_2_ = uVar22;
                auVar9._28_2_ = uVar22;
                auVar9._30_2_ = uVar22;
                auVar6._2_2_ = uVar23;
                auVar6._0_2_ = uVar23;
                auVar6._4_2_ = uVar23;
                auVar6._6_2_ = uVar23;
                auVar6._8_2_ = uVar23;
                auVar6._10_2_ = uVar23;
                auVar6._12_2_ = uVar23;
                auVar6._14_2_ = uVar23;
                auVar6._16_2_ = uVar23;
                auVar6._18_2_ = uVar23;
                auVar6._20_2_ = uVar23;
                auVar6._22_2_ = uVar23;
                auVar6._24_2_ = uVar23;
                auVar6._26_2_ = uVar23;
                auVar6._28_2_ = uVar23;
                auVar6._30_2_ = uVar23;
                do {
                  sVar20 = (short)uVar21;
                  if (uVar17 == (uint)s2Len) {
LAB_0071cb3e:
                    if (sVar20 == 0x7fff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar10 = parasail_result_is_saturated(result);
                    palVar14 = palVar13;
                    if (iVar10 == 0) {
                      if (iVar16 == s2Len + -2) {
                        palVar14 = palVar12;
                      }
                      if (iVar16 == s2Len + -1) {
                        palVar14 = palVar11;
                        palVar11 = palVar13;
                      }
                      iVar10 = uVar1 - 1;
                      for (uVar17 = 0; ((uint)size & 0x7ffffff) << 4 != (uint)uVar17;
                          uVar17 = uVar17 + 1) {
                        if ((*(short *)((long)*palVar14 + uVar17 * 2) == sVar20) &&
                           (iVar18 = ((uint)uVar17 & 0xf) * (uint)size +
                                     ((uint)(uVar17 >> 4) & 0xfffffff), iVar18 < iVar10)) {
                          iVar10 = iVar18;
                        }
                      }
                      if (iVar16 != s2Len + -2) {
                        palVar13 = palVar12;
                      }
                      if (iVar16 != s2Len + -1) {
                        palVar12 = palVar13;
                      }
                      iVar18 = sVar20 + 0x8000;
                    }
                    else {
                      iVar16 = 0;
                      iVar18 = 0xffff;
                      iVar10 = 0;
                    }
                    result->score = iVar18;
                    result->end_query = iVar10;
                    result->end_ref = iVar16;
                    parasail_free(b);
                    parasail_free(palVar14);
                    parasail_free(palVar12);
                    parasail_free(palVar11);
                    return result;
                  }
                  auVar27 = SUB3216(palVar11[(int)size - 1],0);
                  auVar28._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar24;
                  auVar28._16_16_ = ZEXT116(1) * auVar27;
                  auVar4 = vpalignr_avx2((undefined1  [32])palVar11[(int)size - 1],auVar28,0xe);
                  auVar27 = vpblendw_avx(auVar4._0_16_,auVar8,1);
                  auVar4 = vpblendd_avx2(ZEXT1632(auVar27),auVar4,0xf0);
                  iVar18 = ppVar3->mapper[(byte)s2[uVar17]];
                  iVar5 = (int)uVar17;
                  palVar14 = palVar12;
                  if (iVar16 == iVar5 + -2) {
                    palVar14 = palVar13;
                  }
                  auVar28 = auVar7;
                  for (lVar19 = 0; size << 5 != lVar19; lVar19 = lVar19 + 0x20) {
                    auVar30 = vpaddsw_avx2(auVar4,*(undefined1 (*) [32])
                                                   ((long)pvVar2 +
                                                   lVar19 + (long)(iVar18 * (int)size) * 0x20));
                    auVar4 = *(undefined1 (*) [32])((long)*b + lVar19);
                    auVar29 = vpmaxsw_avx2(auVar4,auVar28);
                    auVar30 = vpmaxsw_avx2(auVar30,auVar29);
                    *(undefined1 (*) [32])((long)*palVar14 + lVar19) = auVar30;
                    auVar29 = vpmaxsw_avx2(auVar30,auVar25._0_32_);
                    auVar25 = ZEXT3264(auVar29);
                    auVar30 = vpsubsw_avx2(auVar30,auVar9);
                    auVar4 = vpsubsw_avx2(auVar4,auVar6);
                    auVar4 = vpmaxsw_avx2(auVar4,auVar30);
                    *(undefined1 (*) [32])((long)*b + lVar19) = auVar4;
                    auVar4 = vpsubsw_avx2(auVar28,auVar6);
                    auVar28 = vpmaxsw_avx2(auVar4,auVar30);
                    auVar4 = *(undefined1 (*) [32])((long)*palVar11 + lVar19);
                  }
                  if (iVar16 == iVar5 + -2) {
                    palVar13 = palVar12;
                  }
                  for (iVar18 = 0; iVar18 != 0x10; iVar18 = iVar18 + 1) {
                    auVar30._0_16_ = ZEXT116(0) * auVar28._0_16_ + ZEXT116(1) * auVar24;
                    auVar30._16_16_ = ZEXT116(1) * auVar28._0_16_;
                    auVar4 = vpalignr_avx2(auVar28,auVar30,0xe);
                    auVar27 = vpblendw_avx(auVar4._0_16_,auVar24,1);
                    auVar28 = vpblendd_avx2(ZEXT1632(auVar27),auVar4,0xf0);
                    for (lVar19 = 0; size << 5 != lVar19; lVar19 = lVar19 + 0x20) {
                      auVar4 = vpmaxsw_avx2(auVar28,*(undefined1 (*) [32])((long)*palVar14 + lVar19)
                                           );
                      *(undefined1 (*) [32])((long)*palVar14 + lVar19) = auVar4;
                      auVar30 = vpmaxsw_avx2(auVar4,auVar25._0_32_);
                      auVar25 = ZEXT3264(auVar30);
                      auVar4 = vpsubsw_avx2(auVar4,auVar9);
                      auVar28 = vpsubsw_avx2(auVar28,auVar6);
                      auVar4 = vpcmpgtw_avx2(auVar28,auVar4);
                      if ((((((((((((((((((((((((((((((((auVar4 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar4 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar4 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar4 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar4 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar4 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar4 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar4 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar4 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar4 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar4 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar4 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar4 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar4 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar4 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) && SUB321(auVar4 >> 0x7f,0) == '\0'
                                         ) && (auVar4 >> 0x87 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                       (auVar4 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar4 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar4 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar4 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar4 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar4 >> 0xb7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar4 >> 0xbf,0) == '\0')
                                && (auVar4 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar4 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar4 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar4 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar4 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar4 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar4 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar4[0x1f]) goto LAB_0071cabb;
                    }
                  }
LAB_0071cabb:
                  auVar28 = auVar25._0_32_;
                  auVar4 = vpcmpgtw_avx2(auVar28,auVar26._0_32_);
                  palVar12 = palVar11;
                  palVar11 = palVar14;
                  if ((((((((((((((((((((((((((((((((auVar4 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar4 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar4 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar4 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar4 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar4 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar4 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar4 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar4 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar4 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar4 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar4 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar4 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar4 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar4 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar4 >> 0x7f,0) != '\0') ||
                                    (auVar4 >> 0x87 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar4 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar4 >> 0x97 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar4 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar4 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar4 >> 0xaf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar4 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar4 >> 0xbf,0) != '\0') ||
                            (auVar4 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar4 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar4 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar4 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar4 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar4 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar4 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar4[0x1f] < '\0') {
                    auVar4 = vpermq_avx2(auVar28,0x44);
                    auVar4 = vpmaxsw_avx2(auVar28,auVar4);
                    auVar28 = vpslldq_avx2(auVar4,8);
                    auVar4 = vpmaxsw_avx2(auVar4,auVar28);
                    auVar28 = vpslldq_avx2(auVar4,4);
                    auVar4 = vpmaxsw_avx2(auVar4,auVar28);
                    auVar28 = vpslldq_avx2(auVar4,2);
                    auVar4 = vpmaxsw_avx2(auVar4,auVar28);
                    uVar21 = vpextrw_avx(auVar4._16_16_,7);
                    sVar20 = (short)uVar21;
                    if ((short)(0x7ffe - (short)iVar10) < sVar20) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      s2Len = iVar5;
                      goto LAB_0071cb3e;
                    }
                    auVar4 = vpshufhw_avx2(auVar4,0xff);
                    auVar29._8_4_ = 6;
                    auVar29._0_8_ = 0x600000006;
                    auVar29._12_4_ = 6;
                    auVar29._16_4_ = 6;
                    auVar29._20_4_ = 6;
                    auVar29._24_4_ = 6;
                    auVar29._28_4_ = 6;
                    auVar4 = vpermd_avx2(auVar29,auVar4);
                    auVar26 = ZEXT3264(auVar4);
                    iVar16 = iVar5;
                  }
                  uVar17 = uVar17 + 1;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_striped_profile_avx2_256_16",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}